

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[9],char_const*,char[22],char_const*,char[21],unsigned_int,char[35],unsigned_int,char[49],char_const*,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [9],char **Args_1,
          char (*Args_2) [22],char **Args_3,char (*Args_4) [21],uint *Args_5,char (*Args_6) [35],
          uint *Args_7,char (*Args_8) [49],char **Args_9,char (*Args_10) [3])

{
  stringstream local_1e0 [8];
  stringstream ss;
  char (*Args_local_4) [21];
  char **Args_local_3;
  char (*Args_local_2) [22];
  char **Args_local_1;
  char (*Args_local) [9];
  
  std::__cxx11::stringstream::stringstream(local_1e0);
  FormatStrSS<std::__cxx11::stringstream,char[9],char_const*,char[22],char_const*,char[21],unsigned_int,char[35],unsigned_int,char[49],char_const*,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             (char (*) [9])this,(char **)Args,(char (*) [22])Args_1,(char **)Args_2,
             (char (*) [21])Args_3,(uint *)Args_4,(char (*) [35])Args_5,(uint *)Args_6,
             (char (*) [49])Args_7,(char **)Args_8,(char (*) [3])Args_9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}